

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_cdata_arith(jit_State *J,RecordFFData *rd)

{
  ushort uVar1;
  TRef TVar2;
  GCcdata *pGVar3;
  CType *pCVar4;
  uint *puVar5;
  long *in_RSI;
  GCobj *in_RDI;
  BCIns *pc;
  TRef tr_1;
  CType *cct;
  CTSize ofs;
  GCstr *str;
  CTypeID id_1;
  TRef tr2;
  CTypeID id0;
  IRType t;
  CTypeID id;
  CType *ct;
  TRef tr;
  MSize i;
  CType *s [2];
  TRef sp [2];
  MMS mm;
  CTState *cts;
  CType *ct_2;
  CType *ct_1;
  CTState *cts_1;
  GCobj *in_stack_fffffffffffffc48;
  TraceError e;
  CTSize in_stack_fffffffffffffc50;
  undefined2 in_stack_fffffffffffffc54;
  IRRef1 in_stack_fffffffffffffc56;
  IRRef1 IVar6;
  GCobj *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  undefined2 in_stack_fffffffffffffc64;
  IRRef1 in_stack_fffffffffffffc66;
  GCobj *in_stack_fffffffffffffc68;
  IROp op;
  undefined6 in_stack_fffffffffffffc70;
  IRRef1 in_stack_fffffffffffffc76;
  jit_State *in_stack_fffffffffffffc78;
  undefined4 in_stack_fffffffffffffc80;
  uint in_stack_fffffffffffffc84;
  jit_State *in_stack_fffffffffffffc88;
  TRef local_36c;
  MMS in_stack_fffffffffffffca4;
  CType **in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  uint in_stack_fffffffffffffcb4;
  TRef in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcbc;
  IRType local_340;
  CType *local_338;
  uint local_330;
  uint local_32c;
  long local_328 [2];
  uint local_314 [3];
  jit_State *local_308;
  long *local_300;
  GCobj *local_2f8;
  CType *local_2f0;
  uint local_2e4;
  jit_State *local_2e0;
  CType *local_2d8;
  uint local_2cc;
  jit_State *local_2c8;
  CType *local_2c0;
  jit_State *local_2b8;
  undefined2 local_2ae;
  IRRef1 local_2ac;
  undefined2 local_2aa;
  undefined2 local_29e;
  IRRef1 local_29c;
  undefined2 local_29a;
  undefined2 local_28e;
  IRRef1 local_28c;
  ushort local_28a;
  GCobj *local_288;
  undefined2 local_27e;
  IRRef1 local_27c;
  undefined2 local_27a;
  undefined2 local_26e;
  IRRef1 local_26c;
  undefined2 local_26a;
  GCobj *local_268;
  undefined2 local_25e;
  IRRef1 local_25c;
  ushort local_25a;
  GCobj *local_258;
  undefined2 local_24e;
  IRRef1 local_24c;
  ushort local_24a;
  GCobj *local_248;
  undefined2 local_23e;
  IRRef1 local_23c;
  ushort local_23a;
  GCobj *local_238;
  CType *local_230;
  jit_State *local_228;
  CType *local_220;
  jit_State *local_218;
  CType *local_210;
  jit_State *local_208;
  CType *local_200;
  jit_State *local_1f8;
  CType *local_1f0;
  jit_State *local_1e8;
  CType *local_1e0;
  jit_State *local_1d8;
  uint local_1cc;
  jit_State *local_1c8;
  uint local_1bc;
  jit_State *local_1b8;
  uint local_1ac;
  jit_State *local_1a8;
  uint local_19c;
  jit_State *local_198;
  uint local_18c;
  jit_State *local_188;
  uint local_17c;
  jit_State *local_178;
  uint local_16c;
  jit_State *local_168;
  uint local_15c;
  jit_State *local_158;
  undefined4 local_14c;
  jit_State *local_148;
  undefined4 local_13c;
  jit_State *local_138;
  undefined4 local_12c;
  jit_State *local_128;
  uint local_11c;
  jit_State *local_118;
  CTypeID local_10c;
  jit_State *local_108;
  undefined4 local_fc;
  jit_State *local_f8;
  jit_State *local_f0;
  IRIns *local_e8;
  undefined4 local_dc;
  jit_State *local_d8;
  CTypeID local_cc;
  jit_State *local_c8;
  uint local_bc;
  jit_State *local_b8;
  undefined4 local_ac;
  jit_State *local_a8;
  undefined4 local_9c;
  jit_State *local_98;
  undefined4 local_8c;
  jit_State *local_88;
  uint local_7c;
  jit_State *local_78;
  uint local_6c;
  jit_State *local_68;
  uint local_5c;
  jit_State *local_58;
  uint local_4c;
  jit_State *local_48;
  uint local_3c;
  jit_State *local_38;
  uint local_2c;
  jit_State *local_28;
  uint local_1c;
  jit_State *local_18;
  uint local_c;
  jit_State *local_8;
  
  local_e8 = *(IRIns **)((long)in_RDI + 0x68);
  local_308 = (jit_State *)(ulong)*(uint *)((ulong)local_e8[1].field_1.op12 + 0x194);
  (local_308->cur).ir = local_e8;
  local_314[2] = (uint)in_RSI[2];
  local_32c = 0;
  local_300 = in_RSI;
  local_2f8 = in_RDI;
  local_f0 = local_308;
  do {
    if (1 < local_32c) {
      if (((((local_314[2] != 5) && (local_314[2] != 8)) &&
           ((local_36c = crec_arith_int64(in_stack_fffffffffffffc78,
                                          (TRef *)CONCAT26(in_stack_fffffffffffffc76,
                                                           in_stack_fffffffffffffc70),
                                          (CType **)&in_stack_fffffffffffffc68->cd,
                                          CONCAT22(in_stack_fffffffffffffc66,
                                                   in_stack_fffffffffffffc64)), local_36c != 0 ||
            (local_36c = crec_arith_ptr((jit_State *)
                                        CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8
                                                ),
                                        (TRef *)CONCAT44(in_stack_fffffffffffffcb4,
                                                         in_stack_fffffffffffffcb0),
                                        in_stack_fffffffffffffca8,in_stack_fffffffffffffca4),
            local_36c != 0)))) ||
          (local_36c = crec_arith_meta(in_stack_fffffffffffffc88,
                                       (TRef *)CONCAT44(in_stack_fffffffffffffc84,
                                                        in_stack_fffffffffffffc80),
                                       (CType **)in_stack_fffffffffffffc78,
                                       (CTState *)
                                       CONCAT26(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70)
                                       ,(RecordFFData *)&in_stack_fffffffffffffc68->gch),
          local_36c != 0)) &&
         ((((**(TRef **)((long)local_2f8 + 0x88) = local_36c,
            *(PostProc *)((long)local_2f8 + 0x164) == LJ_POST_FIXGUARD &&
            (((ulong)*(*(lua_State **)((long)local_2f8 + 0x68))->base & 0x700000000) == 0x200000000)
            ) && ((((IRType1 *)((long)local_2f8 + 0x9e))->irt & 0x80) == 0)) &&
          (puVar5 = (uint *)((ulong)*(uint *)((long)(*(lua_State **)((long)local_2f8 + 0x68))->base
                                             + -0xc) - 4), (*puVar5 & 0xff) < 0xc)))) {
        *(uint **)((long)local_2f8 + -0x120) = puVar5;
        *(PostProc *)((long)local_2f8 + 0x164) = LJ_POST_FIXCOMP;
      }
      return;
    }
    local_330 = (*(TRef **)((long)local_2f8 + 0x88))[local_32c];
    local_f8 = local_308;
    local_fc = 0xe;
    local_d8 = local_308;
    local_dc = 0xe;
    local_338 = (CType *)(*(long *)&local_308->cur + 0xe0);
    e = (TraceError)((ulong)in_stack_fffffffffffffc48 >> 0x20);
    if (local_330 == 0) {
      lj_trace_err((jit_State *)
                   CONCAT26(in_stack_fffffffffffffc56,
                            CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)),e);
    }
    op = (IROp)((ulong)in_stack_fffffffffffffc68 >> 0x20);
    IVar6 = (IRRef1)local_330;
    if ((local_330 & 0x1f000000) == 0xa000000) {
      pGVar3 = argv2cdata((jit_State *)CONCAT26(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70)
                          ,op,(cTValue *)
                              CONCAT26(in_stack_fffffffffffffc66,
                                       CONCAT24(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                                      ));
      local_2cc = (uint)pGVar3->ctypeid;
      local_2c8 = local_308;
      local_168 = local_308;
      local_68 = local_308;
      local_2d8 = (CType *)(*(long *)&local_308->cur + (ulong)local_2cc * 0x10);
      while (pCVar4 = local_2d8, local_2d8->info >> 0x1c == 8) {
        local_218 = local_308;
        local_220 = local_2d8;
        local_188 = local_308;
        local_18c = local_2d8->info & 0xffff;
        local_48 = local_308;
        local_4c = local_18c;
        local_2d8 = (CType *)(*(long *)&local_308->cur + (ulong)local_18c * 0x10);
      }
      local_338 = local_2d8;
      local_16c = local_2cc;
      local_6c = local_2cc;
      local_340 = crec_ct2irt((CTState *)local_308,local_2d8);
      uVar1 = (ushort)local_340;
      if (pCVar4->info >> 0x1c == 2) {
        local_23a = uVar1 | 0x4400;
        local_238 = local_2f8;
        local_23e = 0xf;
        *(ushort *)((long)local_2f8 + 0xa4) = local_23a;
        (((FoldState *)((long)local_2f8 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)local_2f8 + 0xa2) = 0xf;
        local_23c = IVar6;
        local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
        if ((pCVar4->info & 0xf0800000) == 0x20800000) {
          local_2b8 = local_308;
          local_2c0 = pCVar4;
          do {
            local_228 = local_308;
            local_230 = local_2c0;
            local_17c = local_2c0->info & 0xffff;
            local_178 = local_308;
            local_58 = local_308;
            local_338 = (CType *)(*(long *)&local_308->cur + (ulong)local_17c * 0x10);
            local_2c0 = local_338;
          } while (local_338->info >> 0x1c == 8);
          local_5c = local_17c;
          local_340 = crec_ct2irt((CTState *)local_308,local_338);
        }
LAB_001b8257:
        if (local_338->info >> 0x1c == 5) {
          local_1e8 = local_308;
          local_1f0 = local_338;
          local_1bc = local_338->info & 0xffff;
          local_1b8 = local_308;
          local_18 = local_308;
          local_338 = (CType *)(*(long *)&local_308->cur + (ulong)local_1bc * 0x10);
          local_1c = local_1bc;
        }
        if (local_338->info >> 0x1c == 0) {
          if (local_340 == IRT_CDATA) {
            local_330 = 0;
          }
          else {
            local_28a = (ushort)local_340 | 0x4500;
            local_288 = local_2f8;
            local_28c = (IRRef1)local_330;
            local_28e = 0;
            *(ushort *)((long)local_2f8 + 0xa4) = local_28a;
            (((FoldState *)((long)local_2f8 + 0xa0))->ins).field_0.op1 = local_28c;
            *(undefined2 *)((long)local_2f8 + 0xa2) = 0;
            local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
          }
        }
      }
      else if ((local_340 == IRT_I64) || (local_340 == IRT_U64)) {
        local_24a = uVar1 | 0x4400;
        local_248 = local_2f8;
        local_24e = 0x11;
        *(ushort *)((long)local_2f8 + 0xa4) = local_24a;
        (((FoldState *)((long)local_2f8 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)local_2f8 + 0xa2) = 0x11;
        local_24c = IVar6;
        local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
      }
      else if ((local_340 == IRT_IGC) || (local_340 == IRT_U32)) {
        local_25a = uVar1 | 0x4400;
        local_258 = local_2f8;
        local_25e = 0x10;
        *(ushort *)((long)local_2f8 + 0xa4) = local_25a;
        (((FoldState *)((long)local_2f8 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)local_2f8 + 0xa2) = 0x10;
        local_25c = IVar6;
        local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
        if (pCVar4->info >> 0x1c == 5) {
          local_1d8 = local_308;
          local_1e0 = pCVar4;
          local_1cc = pCVar4->info & 0xffff;
          local_1c8 = local_308;
          local_8 = local_308;
          local_338 = (CType *)(*(long *)&local_308->cur + (ulong)local_1cc * 0x10);
          local_c = local_1cc;
        }
      }
      else {
        if (pCVar4->info >> 0x1c != 6) {
          in_stack_fffffffffffffc68 = local_2f8;
          TVar2 = lj_ir_kint64((jit_State *)
                               CONCAT26(in_stack_fffffffffffffc56,
                                        CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50
                                                )),(uint64_t)in_stack_fffffffffffffc48);
          local_27a = 0x2909;
          local_27e = (undefined2)TVar2;
          *(undefined2 *)((long)in_stack_fffffffffffffc68 + 0xa4) = 0x2909;
          (((FoldState *)((long)in_stack_fffffffffffffc68 + 0xa0))->ins).field_0.op1 = IVar6;
          *(undefined2 *)((long)in_stack_fffffffffffffc68 + 0xa2) = local_27e;
          local_27c = IVar6;
          local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
          in_stack_fffffffffffffc76 = IVar6;
          goto LAB_001b8257;
        }
        if (local_32c == 0) {
          in_stack_fffffffffffffc84 = 0;
        }
        else {
          in_stack_fffffffffffffc84 = (uint)(local_328[0] - *(long *)&local_308->cur >> 4);
        }
        local_268 = local_2f8;
        local_26a = 0x4409;
        local_26e = 0xf;
        *(undefined2 *)((long)local_2f8 + 0xa4) = 0x4409;
        (((FoldState *)((long)local_2f8 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)local_2f8 + 0xa2) = 0xf;
        in_stack_fffffffffffffcbc = in_stack_fffffffffffffc84;
        local_26c = IVar6;
        local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
        in_stack_fffffffffffffc78 = local_308;
        local_10c = lj_ctype_intern((CTState *)&in_stack_fffffffffffffc58->gch,
                                    CONCAT22(in_stack_fffffffffffffc56,in_stack_fffffffffffffc54),
                                    in_stack_fffffffffffffc50);
        local_338 = (CType *)(*(long *)&in_stack_fffffffffffffc78->cur + (ulong)local_10c * 0x10);
        local_108 = in_stack_fffffffffffffc78;
        local_cc = local_10c;
        local_c8 = in_stack_fffffffffffffc78;
        if (local_32c != 0) {
          local_118 = local_308;
          local_b8 = local_308;
          local_328[0] = *(long *)&local_308->cur + (ulong)in_stack_fffffffffffffcbc * 0x10;
          local_11c = in_stack_fffffffffffffcbc;
          local_bc = in_stack_fffffffffffffcbc;
        }
      }
    }
    else if ((local_330 & 0x1f000000) == 0) {
      if (((local_314[2] != 5) && (local_314[2] != 4)) &&
         ((local_314[2] != 6 && (local_314[2] != 7)))) {
        lj_trace_err((jit_State *)
                     CONCAT26(in_stack_fffffffffffffc56,
                              CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)),e);
      }
      local_330 = lj_ir_kptr_((jit_State *)
                              CONCAT26(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70),op,
                              (void *)CONCAT26(in_stack_fffffffffffffc66,
                                               CONCAT24(in_stack_fffffffffffffc64,
                                                        in_stack_fffffffffffffc60)));
      local_128 = local_308;
      local_12c = 0x11;
      local_a8 = local_308;
      local_ac = 0x11;
      local_338 = (CType *)(*(long *)&local_308->cur + 0x110);
    }
    else if ((local_330 >> 0x18 & 0x1f) - 0xf < 5) {
      local_138 = local_308;
      local_13c = 9;
      local_98 = local_308;
      local_9c = 9;
      local_338 = (CType *)(*(long *)&local_308->cur + 0x90);
    }
    else if ((local_330 & 0x1f000000) == 0x4000000) {
      in_stack_fffffffffffffcb8 = (*(TRef **)((long)local_2f8 + 0x88))[1 - local_32c];
      pGVar3 = argv2cdata((jit_State *)CONCAT26(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70)
                          ,op,(cTValue *)
                              CONCAT26(in_stack_fffffffffffffc66,
                                       CONCAT24(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                                      ));
      in_stack_fffffffffffffcb4 = (uint)pGVar3->ctypeid;
      local_2e0 = local_308;
      local_158 = local_308;
      local_78 = local_308;
      local_2f0 = (CType *)(*(long *)&local_308->cur + (ulong)in_stack_fffffffffffffcb4 * 0x10);
      while (local_2f0->info >> 0x1c == 8) {
        local_208 = local_308;
        local_210 = local_2f0;
        local_198 = local_308;
        local_19c = local_2f0->info & 0xffff;
        local_38 = local_308;
        local_3c = local_19c;
        local_2f0 = (CType *)(*(long *)&local_308->cur + (ulong)local_19c * 0x10);
      }
      local_338 = local_2f0;
      local_2e4 = in_stack_fffffffffffffcb4;
      local_15c = in_stack_fffffffffffffcb4;
      local_7c = in_stack_fffffffffffffcb4;
      if (local_2f0->info >> 0x1c == 5) {
        in_stack_fffffffffffffca8 = (CType **)(ulong)*(uint *)(*local_300 + (ulong)local_32c * 8);
        pCVar4 = lj_ctype_getfieldq((CTState *)in_stack_fffffffffffffc78,
                                    (CType *)CONCAT26(in_stack_fffffffffffffc76,
                                                      in_stack_fffffffffffffc70),
                                    &in_stack_fffffffffffffc68->str,
                                    (CTSize *)
                                    CONCAT26(in_stack_fffffffffffffc66,
                                             CONCAT24(in_stack_fffffffffffffc64,
                                                      in_stack_fffffffffffffc60)),
                                    (CTInfo *)in_stack_fffffffffffffc58);
        if ((pCVar4 == (CType *)0x0) || (pCVar4->info >> 0x1c != 0xb)) {
          lj_trace_err((jit_State *)
                       CONCAT26(in_stack_fffffffffffffc56,
                                CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)),
                       (TraceError)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        }
        in_stack_fffffffffffffc58 = local_2f8;
        TVar2 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffc76,in_stack_fffffffffffffc70)
                          ,in_stack_fffffffffffffc68,CONCAT22(IVar6,in_stack_fffffffffffffc64));
        local_29a = 0x884;
        local_29e = (undefined2)TVar2;
        *(undefined2 *)((long)in_stack_fffffffffffffc58 + 0xa4) = 0x884;
        (((FoldState *)((long)in_stack_fffffffffffffc58 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)in_stack_fffffffffffffc58 + 0xa2) = local_29e;
        local_29c = IVar6;
        lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
        local_1f8 = local_308;
        local_1ac = pCVar4->info & 0xffff;
        local_1a8 = local_308;
        local_28 = local_308;
        local_338 = (CType *)(*(long *)&local_308->cur + (ulong)local_1ac * 0x10);
        local_200 = pCVar4;
        local_2c = local_1ac;
        local_330 = lj_ir_kint((jit_State *)
                               CONCAT26(IVar6,CONCAT24(in_stack_fffffffffffffc64,
                                                       in_stack_fffffffffffffc60)),
                               (int32_t)((ulong)in_stack_fffffffffffffc58 >> 0x20));
        in_stack_fffffffffffffc66 = IVar6;
      }
      else {
        if (local_2f0->info >> 0x1c != 2) {
          lj_trace_err((jit_State *)
                       CONCAT26(in_stack_fffffffffffffc56,
                                CONCAT24(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50)),
                       (TraceError)((ulong)in_stack_fffffffffffffc48 >> 0x20));
        }
        in_stack_fffffffffffffc48 = local_2f8;
        TVar2 = lj_ir_kint64((jit_State *)
                             CONCAT26(IVar6,CONCAT24(in_stack_fffffffffffffc54,
                                                     in_stack_fffffffffffffc50)),(uint64_t)local_2f8
                            );
        local_2aa = 0x2909;
        local_2ae = (undefined2)TVar2;
        *(undefined2 *)((long)in_stack_fffffffffffffc48 + 0xa4) = 0x2909;
        (((FoldState *)((long)in_stack_fffffffffffffc48 + 0xa0))->ins).field_0.op1 = IVar6;
        *(undefined2 *)((long)in_stack_fffffffffffffc48 + 0xa2) = local_2ae;
        local_2ac = IVar6;
        local_330 = lj_opt_fold((jit_State *)&in_stack_fffffffffffffc58->gch);
        in_stack_fffffffffffffc56 = IVar6;
      }
    }
    else if ((local_330 & 0x1f000000) != 0xe000000) {
      local_330 = 0;
      local_148 = local_308;
      local_14c = 0x11;
      local_88 = local_308;
      local_8c = 0x11;
      local_338 = (CType *)(*(long *)&local_308->cur + 0x110);
    }
    local_328[local_32c] = (long)local_338;
    local_314[local_32c] = local_330;
    local_32c = local_32c + 1;
  } while( true );
}

Assistant:

void LJ_FASTCALL recff_cdata_arith(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_cts(J->L);
  MMS mm = (MMS)rd->data;
  TRef sp[2];
  CType *s[2];
  MSize i;
  for (i = 0; i < 2; i++) {
    TRef tr = J->base[i];
    CType *ct = ctype_get(cts, CTID_DOUBLE);
    if (!tr) {
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    } else if (tref_iscdata(tr)) {
      CTypeID id = argv2cdata(J, tr, &rd->argv[i])->ctypeid;
      IRType t;
      ct = ctype_raw(cts, id);
      t = crec_ct2irt(cts, ct);
      if (ctype_isptr(ct->info)) {  /* Resolve pointer or reference. */
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_PTR);
	if (ctype_isref(ct->info)) {
	  ct = ctype_rawchild(cts, ct);
	  t = crec_ct2irt(cts, ct);
	}
      } else if (t == IRT_I64 || t == IRT_U64) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT64);
	lj_needsplit(J);
	goto ok;
      } else if (t == IRT_INT || t == IRT_U32) {
	tr = emitir(IRT(IR_FLOAD, t), tr, IRFL_CDATA_INT);
	if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
	goto ok;
      } else if (ctype_isfunc(ct->info)) {
	CTypeID id0 = i ? ctype_typeid(cts, s[0]) : 0;
	tr = emitir(IRT(IR_FLOAD, IRT_PTR), tr, IRFL_CDATA_PTR);
	ct = ctype_get(cts,
	  lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|id), CTSIZE_PTR));
	if (i) {
	  s[0] = ctype_get(cts, id0);  /* cts->tab may have been reallocated. */
	}
	goto ok;
      } else {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCcdata)));
      }
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info)) {
	if (t == IRT_CDATA) {
	  tr = 0;
	} else {
	  if (t == IRT_I64 || t == IRT_U64) lj_needsplit(J);
	  tr = emitir(IRT(IR_XLOAD, t), tr, 0);
	}
      }
    } else if (tref_isnil(tr)) {
      if (!(mm == MM_len || mm == MM_eq || mm == MM_lt || mm == MM_le))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      tr = lj_ir_kptr(J, NULL);
      ct = ctype_get(cts, CTID_P_VOID);
    } else if (tref_isinteger(tr)) {
      ct = ctype_get(cts, CTID_INT32);
    } else if (tref_isstr(tr)) {
      TRef tr2 = J->base[1-i];
      CTypeID id = argv2cdata(J, tr2, &rd->argv[1-i])->ctypeid;
      ct = ctype_raw(cts, id);
      if (ctype_isenum(ct->info)) {  /* Match string against enum constant. */
	GCstr *str = strV(&rd->argv[i]);
	CTSize ofs;
	CType *cct = lj_ctype_getfield(cts, ct, str, &ofs);
	if (cct && ctype_isconstval(cct->info)) {
	  /* Specialize to the name of the enum constant. */
	  emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, str));
	  ct = ctype_child(cts, cct);
	  tr = lj_ir_kint(J, (int32_t)ofs);
	} else {  /* Interpreter will throw or return false. */
	  lj_trace_err(J, LJ_TRERR_BADTYPE);
	}
      } else if (ctype_isptr(ct->info)) {
	tr = emitir(IRT(IR_ADD, IRT_PTR), tr, lj_ir_kintp(J, sizeof(GCstr)));
      } else {
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      }
    } else if (!tref_isnum(tr)) {
      tr = 0;
      ct = ctype_get(cts, CTID_P_VOID);
    }
  ok:
    s[i] = ct;
    sp[i] = tr;
  }
  {
    TRef tr;
    if ((mm == MM_len || mm == MM_concat ||
	 (!(tr = crec_arith_int64(J, sp, s, mm)) &&
	  !(tr = crec_arith_ptr(J, sp, s, mm)))) &&
	!(tr = crec_arith_meta(J, sp, s, cts, rd)))
      return;
    J->base[0] = tr;
    /* Fixup cdata comparisons, too. Avoids some cdata escapes. */
    if (J->postproc == LJ_POST_FIXGUARD && frame_iscont(J->L->base-1) &&
	!irt_isguard(J->guardemit)) {
      const BCIns *pc = frame_contpc(J->L->base-1) - 1;
      if (bc_op(*pc) <= BC_ISNEP) {
	J2G(J)->tmptv.u64 = (uint64_t)(uintptr_t)pc;
	J->postproc = LJ_POST_FIXCOMP;
      }
    }
  }
}